

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void __thiscall
testing::TestProperty::TestProperty(TestProperty *this,string *a_key,string *a_value)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  std::__cxx11::string::string(in_RDI + 0x20,in_RDX);
  return;
}

Assistant:

TestProperty(const std::string& a_key, const std::string& a_value) :
    key_(a_key), value_(a_value) {
  }